

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O0

void __thiscall Genome::AddSequence(Genome *this,string *seq)

{
  long lVar1;
  length_error *this_00;
  unsigned_long __val;
  string local_c8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *seq_local;
  Genome *this_local;
  
  local_18 = seq;
  seq_local = (string *)this;
  lVar1 = std::__cxx11::string::size();
  if (lVar1 != ((this->super_Polymer).stop_ - (this->super_Polymer).start_) + 1) {
    this_00 = (length_error *)__cxa_allocate_exception(0x10);
    __val = std::__cxx11::string::size();
    std::__cxx11::to_string(&local_98,__val);
    std::operator+(&local_78,"Provided sequence is not the correct size. ",&local_98);
    std::operator+(&local_58,&local_78," ");
    std::__cxx11::to_string
              (&local_c8,((this->super_Polymer).stop_ - (this->super_Polymer).start_) + 1);
    std::operator+(&local_38,&local_58,&local_c8);
    std::length_error::length_error(this_00,(string *)&local_38);
    __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
  }
  MobileElementManager::set_sequence(&(this->super_Polymer).polymerases_,local_18);
  std::__cxx11::string::operator=((string *)&this->seq_,(string *)local_18);
  return;
}

Assistant:

void Genome::AddSequence(const std::string &seq) {
  if (seq.size() != (stop_ - start_ + 1)) { //start_ should always be 1
    throw std::length_error("Provided sequence is not the correct size. " +
                            std::to_string(seq.size()) + " " +
                            std::to_string(stop_ - start_ + 1));
  }
  polymerases_.set_sequence(seq);
  seq_ = seq;
}